

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas_ls.c
# Opt level: O0

int idaLsFree(IDAMem IDA_mem)

{
  long lVar1;
  long in_RDI;
  IDALsMem idals_mem;
  
  if ((in_RDI != 0) && (*(long *)(in_RDI + 0x760) != 0)) {
    lVar1 = *(long *)(in_RDI + 0x760);
    if (*(long *)(lVar1 + 0x30) != 0) {
      N_VDestroy(*(undefined8 *)(lVar1 + 0x30));
      *(undefined8 *)(lVar1 + 0x30) = 0;
    }
    if (*(long *)(lVar1 + 0x38) != 0) {
      N_VDestroy(*(undefined8 *)(lVar1 + 0x38));
      *(undefined8 *)(lVar1 + 0x38) = 0;
    }
    if (*(long *)(lVar1 + 0x40) != 0) {
      N_VDestroy(*(undefined8 *)(lVar1 + 0x40));
      *(undefined8 *)(lVar1 + 0x40) = 0;
    }
    *(undefined8 *)(lVar1 + 0x48) = 0;
    *(undefined8 *)(lVar1 + 0x50) = 0;
    *(undefined8 *)(lVar1 + 0x58) = 0;
    *(undefined8 *)(lVar1 + 0x28) = 0;
    if (*(long *)(lVar1 + 0x110) != 0) {
      (**(code **)(lVar1 + 0x110))(in_RDI);
    }
    free(*(void **)(in_RDI + 0x760));
  }
  return 0;
}

Assistant:

int idaLsFree(IDAMem IDA_mem)
{
  IDALsMem idals_mem;

  /* Return immediately if IDA_mem or IDA_mem->ida_lmem are NULL */
  if (IDA_mem == NULL) { return (IDALS_SUCCESS); }
  if (IDA_mem->ida_lmem == NULL) { return (IDALS_SUCCESS); }
  idals_mem = (IDALsMem)IDA_mem->ida_lmem;

  /* Free N_Vector memory */
  if (idals_mem->ytemp)
  {
    N_VDestroy(idals_mem->ytemp);
    idals_mem->ytemp = NULL;
  }
  if (idals_mem->yptemp)
  {
    N_VDestroy(idals_mem->yptemp);
    idals_mem->yptemp = NULL;
  }
  if (idals_mem->x)
  {
    N_VDestroy(idals_mem->x);
    idals_mem->x = NULL;
  }

  /* Nullify other N_Vector pointers */
  idals_mem->ycur  = NULL;
  idals_mem->ypcur = NULL;
  idals_mem->rcur  = NULL;

  /* Nullify SUNMatrix pointer */
  idals_mem->J = NULL;

  /* Free preconditioner memory (if applicable) */
  if (idals_mem->pfree) { idals_mem->pfree(IDA_mem); }

  /* free IDALs interface structure */
  free(IDA_mem->ida_lmem);

  return (IDALS_SUCCESS);
}